

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O0

bool __thiscall
DSDcc::DSDDMR::processVoiceEmbeddedSignalling
          (DSDDMR *this,int *voiceEmbSig_dibitsIndex,uchar *voiceEmbSigRawBits,bool *voiceEmbSig_OK,
          DMRAddresses *addresses)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ostream *this_00;
  undefined1 *in_RCX;
  uchar *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_R8;
  uchar flco;
  int bit0Index;
  int bit1Index;
  int i;
  uchar parityCheck;
  int local_38;
  byte local_31;
  
  if (*(char *)(in_RDI + 0x1a) != '\0') {
    local_31 = 0;
    local_38 = 0;
    while( true ) {
      if ((0xf < local_38) || (0x3f < *in_RSI)) goto LAB_0011b37e;
      iVar1 = *(int *)(m_embSigInterleave + (long)(*in_RSI << 1) * 4);
      iVar2 = *(int *)(m_embSigInterleave + (long)(*in_RSI * 2 + 1) * 4);
      if (local_38 % 4 == 0) {
        local_31 = 0;
      }
      in_RDX[iVar1] = (byte)((int)(uint)*(byte *)(in_RDI + 0x52 + (long)local_38) >> 1) & 1;
      in_RDX[iVar2] = *(byte *)(in_RDI + 0x52 + (long)local_38) & 1;
      local_31 = local_31 ^ in_RDX[iVar1] ^ in_RDX[iVar2];
      if ((local_38 % 4 == 3) && (local_31 != 0)) break;
      *in_RSI = *in_RSI + 1;
      local_38 = local_38 + 1;
    }
    *in_RCX = 0;
LAB_0011b37e:
    if (*in_RSI == 0x40) {
      bVar3 = Hamming_16_11_4::decode((Hamming_16_11_4 *)(in_RDI + 0x35bd),in_RDX,(uchar *)0x0,7);
      if (bVar3) {
        *(bool *)in_R8 =
             (uchar)(in_RDX[2] * ' ' + in_RDX[3] * '\x10' + in_RDX[4] * '\b' + in_RDX[5] * '\x04' +
                     in_RDX[6] * '\x02' + in_RDX[7]) == '\0';
        *(uint *)(in_R8 + 4) =
             (uint)in_RDX[0x22] * 0x800000 + (uint)in_RDX[0x23] * 0x400000 +
             (uint)in_RDX[0x24] * 0x200000 + (uint)in_RDX[0x25] * 0x100000 +
             (uint)in_RDX[0x26] * 0x80000 + (uint)in_RDX[0x27] * 0x40000 +
             (uint)in_RDX[0x28] * 0x20000 + (uint)in_RDX[0x29] * 0x10000 +
             (uint)in_RDX[0x30] * 0x8000 + (uint)in_RDX[0x31] * 0x4000 + (uint)in_RDX[0x32] * 0x2000
             + (uint)in_RDX[0x33] * 0x1000 + (uint)in_RDX[0x34] * 0x800 + (uint)in_RDX[0x35] * 0x400
             + (uint)in_RDX[0x36] * 0x200 + (uint)in_RDX[0x37] * 0x100 + (uint)in_RDX[0x38] * 0x80 +
             (uint)in_RDX[0x39] * 0x40 + (uint)in_RDX[0x40] * 0x20 + (uint)in_RDX[0x41] * 0x10 +
             (uint)in_RDX[0x42] * 8 + (uint)in_RDX[0x43] * 4 + (uint)in_RDX[0x44] * 2 +
             (uint)in_RDX[0x45];
        *(uint *)(in_R8 + 8) =
             (uint)in_RDX[0x46] * 0x800000 + (uint)in_RDX[0x47] * 0x400000 +
             (uint)in_RDX[0x48] * 0x200000 + (uint)in_RDX[0x49] * 0x100000 +
             (uint)in_RDX[0x50] * 0x80000 + (uint)in_RDX[0x51] * 0x40000 +
             (uint)in_RDX[0x52] * 0x20000 + (uint)in_RDX[0x53] * 0x10000 +
             (uint)in_RDX[0x54] * 0x8000 + (uint)in_RDX[0x55] * 0x4000 + (uint)in_RDX[0x56] * 0x2000
             + (uint)in_RDX[0x57] * 0x1000 + (uint)in_RDX[0x58] * 0x800 + (uint)in_RDX[0x59] * 0x400
             + (uint)in_RDX[0x60] * 0x200 + (uint)in_RDX[0x61] * 0x100 + (uint)in_RDX[0x62] * 0x80 +
             (uint)in_RDX[99] * 0x40 + (uint)in_RDX[100] * 0x20 + (uint)in_RDX[0x65] * 0x10 +
             (uint)in_RDX[0x66] * 8 + (uint)in_RDX[0x67] * 4 + (uint)in_RDX[0x68] * 2 +
             (uint)in_RDX[0x69];
        return true;
      }
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "DSDDMR::processVoiceEmbeddedSignalling: decode error");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      *in_RCX = 0;
    }
  }
  return false;
}

Assistant:

bool DSDDMR::processVoiceEmbeddedSignalling(int& voiceEmbSig_dibitsIndex,
        unsigned char *voiceEmbSigRawBits,
        bool& voiceEmbSig_OK,
        DMRAddresses& addresses)
{
    if (m_lcss != SingleLC_FirstCSBK) // skip RC
    {
        unsigned char parityCheck = 0;

        for (int i = 0; i < IN_DIBITS(DMR_ES_LEN); i++)
        {
            if (voiceEmbSig_dibitsIndex > 63) { // prevent segfault
                break;
            }

            int bit1Index = m_embSigInterleave[2*voiceEmbSig_dibitsIndex];
            int bit0Index = m_embSigInterleave[2*voiceEmbSig_dibitsIndex + 1];

            if ((i%4) == 0)
            {
                parityCheck = 0;
            }

            voiceEmbSigRawBits[bit1Index] = (1 & (m_voiceEmbSig_dibits[i] >> 1)); // bit 1
            voiceEmbSigRawBits[bit0Index] = (1 & m_voiceEmbSig_dibits[i]);        // bit 0
            parityCheck ^= voiceEmbSigRawBits[bit1Index];
            parityCheck ^= voiceEmbSigRawBits[bit0Index];

            if ((i%4) == 3)
            {
                if (parityCheck != 0)
                {
                    voiceEmbSig_OK = false;
                    break;
                }
            }

            voiceEmbSig_dibitsIndex++;
        }

        if (voiceEmbSig_dibitsIndex == 16*4) // BPTC matrix collected
        {
            if (m_hamming_16_11_4.decode(voiceEmbSigRawBits, 0, 7)) // TODO: 5 bit checksum
            {
                unsigned char flco = (voiceEmbSigRawBits[2] << 5)
                        + (voiceEmbSigRawBits[3] << 4)
                        + (voiceEmbSigRawBits[4] << 3)
                        + (voiceEmbSigRawBits[5] << 2)
                        + (voiceEmbSigRawBits[6] << 1)
                        + (voiceEmbSigRawBits[7]);
                addresses.m_group = (flco == 0);
                addresses.m_target = (voiceEmbSigRawBits[16*2 + 2] << 23) // (LC47)
                        + (voiceEmbSigRawBits[16*2 + 3] << 22)
                        + (voiceEmbSigRawBits[16*2 + 4] << 21)
                        + (voiceEmbSigRawBits[16*2 + 5] << 20)
                        + (voiceEmbSigRawBits[16*2 + 6] << 19)
                        + (voiceEmbSigRawBits[16*2 + 7] << 18)
                        + (voiceEmbSigRawBits[16*2 + 8] << 17)
                        + (voiceEmbSigRawBits[16*2 + 9] << 16) // 2:7
                        + (voiceEmbSigRawBits[16*3 + 0] << 15) // (LC39)
                        + (voiceEmbSigRawBits[16*3 + 1] << 14)
                        + (voiceEmbSigRawBits[16*3 + 2] << 13)
                        + (voiceEmbSigRawBits[16*3 + 3] << 12)
                        + (voiceEmbSigRawBits[16*3 + 4] << 11)
                        + (voiceEmbSigRawBits[16*3 + 5] << 10)
                        + (voiceEmbSigRawBits[16*3 + 6] << 9)
                        + (voiceEmbSigRawBits[16*3 + 7] << 8)  // 1:7
                        + (voiceEmbSigRawBits[16*3 + 8] << 7)  // (LC31)
                        + (voiceEmbSigRawBits[16*3 + 9] << 6)
                        + (voiceEmbSigRawBits[16*4 + 0] << 5)  // (LC29)
                        + (voiceEmbSigRawBits[16*4 + 1] << 4)
                        + (voiceEmbSigRawBits[16*4 + 2] << 3)
                        + (voiceEmbSigRawBits[16*4 + 3] << 2)
                        + (voiceEmbSigRawBits[16*4 + 4] << 1)
                        + (voiceEmbSigRawBits[16*4 + 5]);      // (LC24)
                addresses.m_source = (voiceEmbSigRawBits[16*4 + 6] << 23) // (LC23)
                        + (voiceEmbSigRawBits[16*4 + 7] << 22)
                        + (voiceEmbSigRawBits[16*4 + 8] << 21)
                        + (voiceEmbSigRawBits[16*4 + 9] << 20)
                        + (voiceEmbSigRawBits[16*5 + 0] << 19)
                        + (voiceEmbSigRawBits[16*5 + 1] << 18)
                        + (voiceEmbSigRawBits[16*5 + 2] << 17)
                        + (voiceEmbSigRawBits[16*5 + 3] << 16) // 2:7
                        + (voiceEmbSigRawBits[16*5 + 4] << 15) // (LC15)
                        + (voiceEmbSigRawBits[16*5 + 5] << 14)
                        + (voiceEmbSigRawBits[16*5 + 6] << 13)
                        + (voiceEmbSigRawBits[16*5 + 7] << 12)
                        + (voiceEmbSigRawBits[16*5 + 8] << 11)
                        + (voiceEmbSigRawBits[16*5 + 9] << 10)
                        + (voiceEmbSigRawBits[16*6 + 0] << 9)
                        + (voiceEmbSigRawBits[16*6 + 1] << 8)  // 1:7
                        + (voiceEmbSigRawBits[16*6 + 2] << 7)  // (LC7)
                        + (voiceEmbSigRawBits[16*6 + 3] << 6)
                        + (voiceEmbSigRawBits[16*6 + 4] << 5)
                        + (voiceEmbSigRawBits[16*6 + 5] << 4)
                        + (voiceEmbSigRawBits[16*6 + 6] << 3)
                        + (voiceEmbSigRawBits[16*6 + 7] << 2)
                        + (voiceEmbSigRawBits[16*6 + 8] << 1)
                        + (voiceEmbSigRawBits[16*6 + 9]);      // (LC0)

                return true; // we have a result
            }
            else
            {
                std::cerr << "DSDDMR::processVoiceEmbeddedSignalling: decode error" << std::endl;
                voiceEmbSig_OK = false;
            }
        }
    }

    return false; // no result yet or KO
}